

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O1

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::toString_abi_cxx11_
          (string *__return_storage_ptr__,SixAxisForceTorqueSensor *this,Model *param_1)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream ss;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Sensor ",7);
  (*(this->super_JointSensor).super_Sensor._vptr_Sensor[2])(&local_1f0,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1f0,local_1e8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0," is attached to joint ",0x16);
  (*(this->super_JointSensor).super_Sensor._vptr_Sensor[9])(&local_1f0,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1f0,local_1e8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ( ",3);
  (*(this->super_JointSensor).super_Sensor._vptr_Sensor[10])(this);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ) ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0," that connects  ",0x10);
  pcVar1 = (this->pimpl->link1Name)._M_dataplus._M_p;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar1,pcVar1 + (this->pimpl->link1Name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1f0,local_1e8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ( ",3);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ) and ",7);
  pcVar1 = (this->pimpl->link2Name)._M_dataplus._M_p;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + (this->pimpl->link2Name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ( ",3);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string SixAxisForceTorqueSensor::toString(const Model&  /*model*/) const
{
    std::stringstream ss;

    ss << "Sensor " << this->getName() << std::endl;
    ss << " is attached to joint " << this->getParentJoint() << " ( " << this->getParentJointIndex() << " ) " << std::endl;
    ss << " that connects  " << this->getFirstLinkName() << " ( " << this->getFirstLinkIndex() << " ) and "
                             << this->getSecondLinkName() << " ( " << this->getSecondLinkIndex() << std::endl;

    return ss.str();
}